

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_out_prod(ggml_compute_params *params,ggml_tensor *dst)

{
  void *pvVar1;
  int *piVar2;
  uint *puVar3;
  ggml_type gVar4;
  int iVar5;
  int iVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  code *pcVar22;
  void *pvVar23;
  void *pvVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  byte bVar38;
  byte bVar39;
  long lVar40;
  size_t sVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  void *pvVar49;
  ulong uVar50;
  ulong uVar51;
  char *pcVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  undefined8 uVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  ulong uVar64;
  long lVar65;
  ulong uVar66;
  int64_t i11;
  long lVar67;
  ulong uVar68;
  int np;
  int j;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  int i;
  long lVar73;
  long lVar74;
  uint uVar75;
  ushort uVar76;
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  float *v [32];
  float *x [32];
  __m512 vx [32];
  long local_bc0;
  undefined8 auStack_a80 [32];
  long alStack_980 [32];
  undefined1 auStack_880 [2128];
  
  pgVar7 = dst->src[0];
  gVar4 = pgVar7->type;
  uVar54 = (ulong)gVar4;
  if (uVar54 < 0x24) {
    if ((0xc20ff7dccU >> (uVar54 & 0x3f) & 1) != 0) {
      pgVar8 = dst->src[1];
      lVar42 = pgVar7->ne[0];
      lVar9 = pgVar7->ne[1];
      lVar65 = pgVar7->ne[2];
      lVar48 = pgVar7->ne[3];
      sVar10 = pgVar7->nb[0];
      sVar11 = pgVar7->nb[1];
      sVar12 = pgVar7->nb[2];
      sVar13 = pgVar7->nb[3];
      lVar61 = pgVar8->ne[0];
      lVar43 = pgVar8->ne[2];
      lVar44 = pgVar8->ne[3];
      sVar14 = pgVar8->nb[0];
      sVar15 = pgVar8->nb[1];
      sVar16 = pgVar8->nb[2];
      sVar17 = pgVar8->nb[3];
      lVar70 = dst->ne[0];
      lVar72 = dst->ne[1];
      lVar69 = dst->ne[2];
      lVar73 = dst->ne[3];
      sVar18 = dst->nb[0];
      sVar19 = dst->nb[1];
      sVar20 = dst->nb[2];
      sVar21 = dst->nb[3];
      iVar5 = params->ith;
      iVar6 = params->nth;
      lVar40 = ggml_get_type_traits(uVar54);
      if (lVar65 == lVar43) {
        if (lVar48 == lVar44) {
          if (lVar69 == lVar43) {
            if (lVar73 == lVar44) {
              pcVar22 = *(code **)(lVar40 + 0x28);
              sVar41 = ggml_type_size(gVar4);
              if (sVar10 == sVar41) {
                if (sVar18 == 4) {
                  if (lVar70 == lVar42) {
                    if (lVar72 == lVar61) {
                      if (lVar69 == lVar65) {
                        if (lVar73 == lVar48) {
                          uVar75 = (uint)lVar70;
                          if ((iVar5 == 0) &&
                             (uVar53 = uVar75 * (int)lVar73 * (int)lVar69 * (int)lVar72,
                             0 < (int)uVar53)) {
                            memset(dst->data,0,(ulong)(uVar53 & 0x7fffffff) << 2);
                          }
                          ggml_barrier(params->threadpool);
                          lVar69 = lVar69 * lVar72;
                          lVar73 = lVar73 * lVar69;
                          lVar42 = (lVar73 + -1 + (long)iVar6) / (long)iVar6;
                          local_bc0 = lVar42 * iVar5;
                          lVar42 = lVar42 + local_bc0;
                          if (lVar73 <= lVar42) {
                            lVar42 = lVar73;
                          }
                          if (local_bc0 < lVar42) {
                            pvVar23 = params->wdata;
                            lVar48 = (lVar70 + 0x10) * (long)iVar5;
                            pvVar1 = (void *)((long)pvVar23 + lVar48 * 4);
                            uVar53 = uVar75 & 0xffffffc0;
                            lVar61 = (long)(int)uVar53;
                            lVar65 = (long)(int)uVar75;
                            if ((long)(int)uVar75 < lVar61 + 1) {
                              lVar65 = lVar61 + 1;
                            }
                            auVar77 = vpbroadcastq_avx512f();
                            auVar77 = vmovdqa64_avx512f(auVar77);
                            do {
                              if (0 < lVar9) {
                                lVar43 = local_bc0 / lVar69;
                                lVar44 = (local_bc0 % lVar69) / lVar72;
                                lVar40 = (local_bc0 % lVar69) % lVar72;
                                lVar62 = lVar43 * sVar21 + lVar40 * sVar19 + lVar44 * sVar20;
                                lVar73 = 0;
                                do {
                                  pvVar49 = pgVar8->data;
                                  pvVar24 = dst->data;
                                  (*pcVar22)((long)pgVar7->data +
                                             lVar43 * sVar13 + lVar44 * sVar12 + lVar73 * sVar11,
                                             pvVar1,lVar70);
                                  auVar78 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                  auVar79 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                  auVar80 = vmovdqa64_avx512f(auVar77);
                                  auVar81 = vbroadcastss_avx512f
                                                      (ZEXT416(*(uint *)((long)pvVar49 +
                                                                        lVar43 * sVar17 +
                                                                        lVar73 * sVar15 +
                                                                        lVar44 * sVar16 +
                                                                        lVar40 * sVar14)));
                                  if (0 < (int)uVar53) {
                                    lVar45 = lVar62 + (long)pvVar24;
                                    uVar54 = 0;
                                    pvVar49 = pvVar1;
                                    do {
                                      lVar59 = 0;
                                      do {
                                        auVar82 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                       ((long)pvVar49 + lVar59),
                                                                      auVar81,*(undefined1 (*) [64])
                                                                               (lVar45 + lVar59));
                                        *(undefined1 (*) [64])(lVar45 + lVar59) = auVar82;
                                        lVar59 = lVar59 + 0x40;
                                      } while (lVar59 != 0x100);
                                      uVar54 = uVar54 + 0x40;
                                      lVar45 = lVar45 + 0x100;
                                      pvVar49 = (void *)((long)pvVar49 + 0x100);
                                    } while (uVar54 < uVar53);
                                  }
                                  if (uVar53 != uVar75) {
                                    auVar81 = vbroadcastss_avx512f(auVar81._0_16_);
                                    lVar45 = lVar62 + lVar61 * 4;
                                    uVar54 = 0;
                                    do {
                                      auVar82 = vpbroadcastq_avx512f();
                                      auVar83 = vporq_avx512f(auVar82,auVar79);
                                      auVar82 = vporq_avx512f(auVar82,auVar78);
                                      uVar60 = vpcmpuq_avx512f(auVar82,auVar80,2);
                                      bVar38 = (byte)uVar60;
                                      uVar60 = vpcmpuq_avx512f(auVar83,auVar80,2);
                                      bVar39 = (byte)uVar60;
                                      uVar76 = CONCAT11(bVar39,bVar38);
                                      piVar2 = (int *)((long)pvVar23 +
                                                      uVar54 * 4 + lVar61 * 4 + lVar48 * 4);
                                      auVar82._4_4_ = (uint)((byte)(uVar76 >> 1) & 1) * piVar2[1];
                                      auVar82._0_4_ = (uint)(bVar38 & 1) * *piVar2;
                                      auVar82._8_4_ = (uint)((byte)(uVar76 >> 2) & 1) * piVar2[2];
                                      auVar82._12_4_ = (uint)((byte)(uVar76 >> 3) & 1) * piVar2[3];
                                      auVar82._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * piVar2[4];
                                      auVar82._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * piVar2[5];
                                      auVar82._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * piVar2[6];
                                      auVar82._28_4_ = (uint)((byte)(uVar76 >> 7) & 1) * piVar2[7];
                                      auVar82._32_4_ = (uint)(bVar39 & 1) * piVar2[8];
                                      auVar82._36_4_ = (uint)(bVar39 >> 1 & 1) * piVar2[9];
                                      auVar82._40_4_ = (uint)(bVar39 >> 2 & 1) * piVar2[10];
                                      auVar82._44_4_ = (uint)(bVar39 >> 3 & 1) * piVar2[0xb];
                                      auVar82._48_4_ = (uint)(bVar39 >> 4 & 1) * piVar2[0xc];
                                      auVar82._52_4_ = (uint)(bVar39 >> 5 & 1) * piVar2[0xd];
                                      auVar82._56_4_ = (uint)(bVar39 >> 6 & 1) * piVar2[0xe];
                                      auVar82._60_4_ = (uint)(bVar39 >> 7) * piVar2[0xf];
                                      piVar2 = (int *)((long)pvVar24 + uVar54 * 4 + lVar45);
                                      auVar83._4_4_ = (uint)((byte)(uVar76 >> 1) & 1) * piVar2[1];
                                      auVar83._0_4_ = (uint)(bVar38 & 1) * *piVar2;
                                      auVar83._8_4_ = (uint)((byte)(uVar76 >> 2) & 1) * piVar2[2];
                                      auVar83._12_4_ = (uint)((byte)(uVar76 >> 3) & 1) * piVar2[3];
                                      auVar83._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * piVar2[4];
                                      auVar83._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * piVar2[5];
                                      auVar83._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * piVar2[6];
                                      auVar83._28_4_ = (uint)((byte)(uVar76 >> 7) & 1) * piVar2[7];
                                      auVar83._32_4_ = (uint)(bVar39 & 1) * piVar2[8];
                                      auVar83._36_4_ = (uint)(bVar39 >> 1 & 1) * piVar2[9];
                                      auVar83._40_4_ = (uint)(bVar39 >> 2 & 1) * piVar2[10];
                                      auVar83._44_4_ = (uint)(bVar39 >> 3 & 1) * piVar2[0xb];
                                      auVar83._48_4_ = (uint)(bVar39 >> 4 & 1) * piVar2[0xc];
                                      auVar83._52_4_ = (uint)(bVar39 >> 5 & 1) * piVar2[0xd];
                                      auVar83._56_4_ = (uint)(bVar39 >> 6 & 1) * piVar2[0xe];
                                      auVar83._60_4_ = (uint)(bVar39 >> 7) * piVar2[0xf];
                                      auVar82 = vfmadd231ps_avx512f(auVar83,auVar81,auVar82);
                                      puVar3 = (uint *)((long)pvVar24 + uVar54 * 4 + lVar45);
                                      bVar25 = (bool)((byte)(uVar76 >> 1) & 1);
                                      bVar26 = (bool)((byte)(uVar76 >> 2) & 1);
                                      bVar27 = (bool)((byte)(uVar76 >> 3) & 1);
                                      bVar28 = (bool)((byte)(uVar76 >> 4) & 1);
                                      bVar29 = (bool)((byte)(uVar76 >> 5) & 1);
                                      bVar30 = (bool)((byte)(uVar76 >> 6) & 1);
                                      bVar31 = (bool)((byte)(uVar76 >> 7) & 1);
                                      bVar32 = (bool)(bVar39 >> 1 & 1);
                                      bVar33 = (bool)(bVar39 >> 2 & 1);
                                      bVar34 = (bool)(bVar39 >> 3 & 1);
                                      bVar35 = (bool)(bVar39 >> 4 & 1);
                                      bVar36 = (bool)(bVar39 >> 5 & 1);
                                      bVar37 = (bool)(bVar39 >> 6 & 1);
                                      *puVar3 = (uint)(bVar38 & 1) * auVar82._0_4_ |
                                                (uint)!(bool)(bVar38 & 1) * *puVar3;
                                      puVar3[1] = (uint)bVar25 * auVar82._4_4_ |
                                                  (uint)!bVar25 * puVar3[1];
                                      puVar3[2] = (uint)bVar26 * auVar82._8_4_ |
                                                  (uint)!bVar26 * puVar3[2];
                                      puVar3[3] = (uint)bVar27 * auVar82._12_4_ |
                                                  (uint)!bVar27 * puVar3[3];
                                      puVar3[4] = (uint)bVar28 * auVar82._16_4_ |
                                                  (uint)!bVar28 * puVar3[4];
                                      puVar3[5] = (uint)bVar29 * auVar82._20_4_ |
                                                  (uint)!bVar29 * puVar3[5];
                                      puVar3[6] = (uint)bVar30 * auVar82._24_4_ |
                                                  (uint)!bVar30 * puVar3[6];
                                      puVar3[7] = (uint)bVar31 * auVar82._28_4_ |
                                                  (uint)!bVar31 * puVar3[7];
                                      puVar3[8] = (uint)(bVar39 & 1) * auVar82._32_4_ |
                                                  (uint)!(bool)(bVar39 & 1) * puVar3[8];
                                      puVar3[9] = (uint)bVar32 * auVar82._36_4_ |
                                                  (uint)!bVar32 * puVar3[9];
                                      puVar3[10] = (uint)bVar33 * auVar82._40_4_ |
                                                   (uint)!bVar33 * puVar3[10];
                                      puVar3[0xb] = (uint)bVar34 * auVar82._44_4_ |
                                                    (uint)!bVar34 * puVar3[0xb];
                                      puVar3[0xc] = (uint)bVar35 * auVar82._48_4_ |
                                                    (uint)!bVar35 * puVar3[0xc];
                                      puVar3[0xd] = (uint)bVar36 * auVar82._52_4_ |
                                                    (uint)!bVar36 * puVar3[0xd];
                                      puVar3[0xe] = (uint)bVar37 * auVar82._56_4_ |
                                                    (uint)!bVar37 * puVar3[0xe];
                                      puVar3[0xf] = (uint)(bVar39 >> 7) * auVar82._60_4_ |
                                                    (uint)!(bool)(bVar39 >> 7) * puVar3[0xf];
                                      uVar54 = uVar54 + 0x10;
                                    } while (((lVar65 - lVar61) + 0xfU & 0xfffffffffffffff0) !=
                                             uVar54);
                                  }
                                  lVar73 = lVar73 + 1;
                                } while (lVar73 != lVar9);
                              }
                              local_bc0 = local_bc0 + 1;
                            } while (local_bc0 != lVar42);
                          }
                          return;
                        }
                        pcVar52 = "ne3 == ne03";
                        uVar60 = 0xe96;
                      }
                      else {
                        pcVar52 = "ne2 == ne02";
                        uVar60 = 0xe95;
                      }
                    }
                    else {
                      pcVar52 = "ne1 == ne10";
                      uVar60 = 0xe94;
                    }
                  }
                  else {
                    pcVar52 = "ne0 == ne00";
                    uVar60 = 0xe93;
                  }
                }
                else {
                  pcVar52 = "nb0 == sizeof(float)";
                  uVar60 = 0xe8e;
                }
              }
              else {
                pcVar52 = "nb00 == ggml_type_size(type)";
                uVar60 = 0xe8b;
              }
            }
            else {
              pcVar52 = "ne3 == ne13";
              uVar60 = 0xe88;
            }
          }
          else {
            pcVar52 = "ne2 == ne12";
            uVar60 = 0xe87;
          }
        }
        else {
          pcVar52 = "ne03 == ne13";
          uVar60 = 0xe86;
        }
      }
      else {
        pcVar52 = "ne02 == ne12";
        uVar60 = 0xe85;
      }
LAB_0013c41c:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                 ,uVar60,"GGML_ASSERT(%s) failed",pcVar52);
    }
    if (uVar54 == 0) {
      if (dst->type == GGML_TYPE_F32) {
        if (gVar4 == GGML_TYPE_F32) {
          pgVar8 = dst->src[1];
          if (pgVar8->type == GGML_TYPE_F32) {
            if (dst->ne[0] == pgVar7->ne[0]) {
              lVar42 = dst->ne[1];
              if (lVar42 == pgVar8->ne[0]) {
                lVar9 = dst->ne[2];
                if (lVar9 == pgVar8->ne[2]) {
                  lVar65 = dst->ne[3];
                  if (lVar65 == pgVar8->ne[3]) {
                    lVar48 = pgVar7->ne[2];
                    if (lVar9 % lVar48 == 0) {
                      lVar61 = pgVar7->ne[3];
                      if (lVar65 % lVar61 == 0) {
                        if (pgVar7->nb[0] == 4) {
                          if (dst->nb[0] == 4) {
                            uVar54 = pgVar7->ne[1];
                            sVar10 = pgVar7->nb[1];
                            sVar11 = pgVar7->nb[2];
                            sVar12 = pgVar7->nb[3];
                            sVar13 = pgVar8->nb[0];
                            sVar14 = pgVar8->nb[1];
                            sVar15 = pgVar8->nb[2];
                            sVar16 = pgVar8->nb[3];
                            sVar17 = dst->nb[1];
                            sVar18 = dst->nb[2];
                            sVar19 = dst->nb[3];
                            iVar5 = params->ith;
                            iVar6 = params->nth;
                            uVar75 = (uint)dst->ne[0];
                            if ((iVar5 == 0) &&
                               (uVar53 = uVar75 * (int)lVar65 * (int)lVar9 * (int)lVar42,
                               0 < (int)uVar53)) {
                              memset(dst->data,0,(ulong)(uVar53 & 0x7fffffff) << 2);
                            }
                            ggml_barrier(params->threadpool);
                            lVar70 = lVar9 * lVar42;
                            lVar72 = lVar65 * lVar70;
                            lVar43 = (lVar72 + -1 + (long)iVar6) / (long)iVar6;
                            lVar44 = iVar5 * lVar43;
                            lVar43 = lVar43 + lVar44;
                            if (lVar72 <= lVar43) {
                              lVar43 = lVar72;
                            }
                            if (lVar43 <= lVar44) {
                              return;
                            }
                            uVar53 = uVar75 & 0xffffffc0;
                            lVar69 = (long)(int)uVar53;
                            lVar72 = (long)(int)uVar75;
                            if ((long)(int)uVar75 < lVar69 + 1) {
                              lVar72 = lVar69 + 1;
                            }
                            auVar77 = vpbroadcastq_avx512f();
                            auVar78 = vpbroadcastq_avx512f();
                            auVar79 = vpbroadcastq_avx512f();
                            uVar66 = (lVar72 - lVar69) + 0xfU & 0xfffffffffffffff0;
                            lVar69 = lVar69 * 4;
                            auVar80 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                            auVar81 = vpbroadcastq_avx512f(ZEXT816(8));
                            auVar82 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                            auVar83 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                            do {
                              lVar72 = lVar44 + 0x10;
                              lVar73 = lVar43;
                              if (lVar72 < lVar43) {
                                lVar73 = lVar72;
                              }
                              if (0 < (long)uVar54) {
                                uVar46 = 0x20;
                                uVar55 = 0;
                                do {
                                  uVar47 = uVar46;
                                  if ((long)uVar54 < (long)uVar46) {
                                    uVar47 = uVar54;
                                  }
                                  lVar40 = (uVar47 >> 5 & 0x3ffffffffffffff) * sVar10 * 0x20;
                                  uVar47 = uVar55 + 0x20;
                                  uVar50 = uVar54;
                                  if ((long)uVar47 < (long)uVar54) {
                                    uVar50 = uVar47;
                                  }
                                  uVar51 = uVar50 & 0x7fffffffffffffe0;
                                  lVar62 = lVar44;
                                  do {
                                    lVar45 = lVar62 / lVar70;
                                    lVar59 = (lVar62 % lVar70) / lVar42;
                                    lVar56 = (lVar62 % lVar70) % lVar42;
                                    if (uVar55 < uVar51) {
                                      lVar63 = lVar56 * sVar17;
                                      lVar57 = lVar59 * sVar18;
                                      lVar67 = lVar45 * sVar19;
                                      uVar68 = uVar55;
                                      do {
                                        pvVar1 = dst->data;
                                        auVar84 = vpbroadcastq_avx512f();
                                        auVar85 = vpbroadcastq_avx512f();
                                        lVar58 = 0;
                                        auVar86 = vmovdqa64_avx512f(auVar80);
                                        do {
                                          auVar87 = vpmullq_avx512dq(auVar86,auVar77);
                                          auVar87 = vpaddq_avx512f(auVar84,auVar87);
                                          auVar87 = vmovdqu64_avx512f(auVar87);
                                          *(undefined1 (*) [64])(alStack_980 + lVar58) = auVar87;
                                          auVar87 = vpmullq_avx512dq(auVar86,auVar78);
                                          auVar87 = vpaddq_avx512f(auVar85,auVar87);
                                          auVar87 = vmovdqu64_avx512f(auVar87);
                                          *(undefined1 (*) [64])(auStack_a80 + lVar58) = auVar87;
                                          lVar58 = lVar58 + 8;
                                          auVar86 = vpaddq_avx512f(auVar86,auVar81);
                                        } while (lVar58 != 0x20);
                                        lVar58 = 0;
                                        do {
                                          auVar84 = vbroadcastss_avx512f
                                                              (ZEXT416(**(uint **)((long)auStack_a80
                                                                                  + lVar58)));
                                          *(undefined1 (*) [64])(auStack_880 + lVar58 * 8) = auVar84
                                          ;
                                          lVar58 = lVar58 + 8;
                                        } while (lVar58 != 0x100);
                                        if (0 < (int)uVar53) {
                                          uVar64 = 0;
                                          do {
                                            lVar58 = uVar64 * 4 + lVar67 + lVar57 + lVar63;
                                            lVar71 = 0;
                                            do {
                                              auVar84 = *(undefined1 (*) [64])
                                                         ((long)pvVar1 + lVar71 * 0x40 + lVar58);
                                              lVar74 = 0;
                                              do {
                                                auVar84 = vfmadd231ps_avx512f(auVar84,*(undefined1
                                                                                        (*) [64])
                                                                                       (uVar64 * 4 +
                                                                                        *(long *)((
                                                  long)alStack_980 + lVar74) + lVar71 * 0x40),
                                                  *(undefined1 (*) [64])(auStack_880 + lVar74 * 8));
                                                lVar74 = lVar74 + 8;
                                              } while (lVar74 != 0x100);
                                              *(undefined1 (*) [64])
                                               ((long)pvVar1 + lVar71 * 0x40 + lVar58) = auVar84;
                                              lVar71 = lVar71 + 1;
                                            } while (lVar71 != 4);
                                            uVar64 = uVar64 + 0x40;
                                          } while (uVar64 < uVar53);
                                        }
                                        lVar58 = lVar63 + lVar67 + lVar57 + lVar69;
                                        lVar71 = 0;
                                        do {
                                          if (uVar53 != uVar75) {
                                            auVar84 = vbroadcastss_avx512f
                                                                (ZEXT416(*(uint *)auStack_a80
                                                                                  [lVar71]));
                                            lVar74 = alStack_980[lVar71];
                                            uVar64 = 0;
                                            do {
                                              auVar85 = vpbroadcastq_avx512f();
                                              auVar86 = vporq_avx512f(auVar85,auVar82);
                                              auVar85 = vporq_avx512f(auVar85,auVar83);
                                              uVar60 = vpcmpuq_avx512f(auVar85,auVar79,2);
                                              bVar38 = (byte)uVar60;
                                              uVar60 = vpcmpuq_avx512f(auVar86,auVar79,2);
                                              bVar39 = (byte)uVar60;
                                              uVar76 = CONCAT11(bVar39,bVar38);
                                              piVar2 = (int *)(lVar74 + lVar69 + uVar64 * 4);
                                              auVar85._4_4_ =
                                                   (uint)((byte)(uVar76 >> 1) & 1) * piVar2[1];
                                              auVar85._0_4_ = (uint)(bVar38 & 1) * *piVar2;
                                              auVar85._8_4_ =
                                                   (uint)((byte)(uVar76 >> 2) & 1) * piVar2[2];
                                              auVar85._12_4_ =
                                                   (uint)((byte)(uVar76 >> 3) & 1) * piVar2[3];
                                              auVar85._16_4_ =
                                                   (uint)((byte)(uVar76 >> 4) & 1) * piVar2[4];
                                              auVar85._20_4_ =
                                                   (uint)((byte)(uVar76 >> 5) & 1) * piVar2[5];
                                              auVar85._24_4_ =
                                                   (uint)((byte)(uVar76 >> 6) & 1) * piVar2[6];
                                              auVar85._28_4_ =
                                                   (uint)((byte)(uVar76 >> 7) & 1) * piVar2[7];
                                              auVar85._32_4_ = (uint)(bVar39 & 1) * piVar2[8];
                                              auVar85._36_4_ = (uint)(bVar39 >> 1 & 1) * piVar2[9];
                                              auVar85._40_4_ = (uint)(bVar39 >> 2 & 1) * piVar2[10];
                                              auVar85._44_4_ = (uint)(bVar39 >> 3 & 1) * piVar2[0xb]
                                              ;
                                              auVar85._48_4_ = (uint)(bVar39 >> 4 & 1) * piVar2[0xc]
                                              ;
                                              auVar85._52_4_ = (uint)(bVar39 >> 5 & 1) * piVar2[0xd]
                                              ;
                                              auVar85._56_4_ = (uint)(bVar39 >> 6 & 1) * piVar2[0xe]
                                              ;
                                              auVar85._60_4_ = (uint)(bVar39 >> 7) * piVar2[0xf];
                                              piVar2 = (int *)((long)pvVar1 + uVar64 * 4 + lVar58);
                                              auVar86._4_4_ =
                                                   (uint)((byte)(uVar76 >> 1) & 1) * piVar2[1];
                                              auVar86._0_4_ = (uint)(bVar38 & 1) * *piVar2;
                                              auVar86._8_4_ =
                                                   (uint)((byte)(uVar76 >> 2) & 1) * piVar2[2];
                                              auVar86._12_4_ =
                                                   (uint)((byte)(uVar76 >> 3) & 1) * piVar2[3];
                                              auVar86._16_4_ =
                                                   (uint)((byte)(uVar76 >> 4) & 1) * piVar2[4];
                                              auVar86._20_4_ =
                                                   (uint)((byte)(uVar76 >> 5) & 1) * piVar2[5];
                                              auVar86._24_4_ =
                                                   (uint)((byte)(uVar76 >> 6) & 1) * piVar2[6];
                                              auVar86._28_4_ =
                                                   (uint)((byte)(uVar76 >> 7) & 1) * piVar2[7];
                                              auVar86._32_4_ = (uint)(bVar39 & 1) * piVar2[8];
                                              auVar86._36_4_ = (uint)(bVar39 >> 1 & 1) * piVar2[9];
                                              auVar86._40_4_ = (uint)(bVar39 >> 2 & 1) * piVar2[10];
                                              auVar86._44_4_ = (uint)(bVar39 >> 3 & 1) * piVar2[0xb]
                                              ;
                                              auVar86._48_4_ = (uint)(bVar39 >> 4 & 1) * piVar2[0xc]
                                              ;
                                              auVar86._52_4_ = (uint)(bVar39 >> 5 & 1) * piVar2[0xd]
                                              ;
                                              auVar86._56_4_ = (uint)(bVar39 >> 6 & 1) * piVar2[0xe]
                                              ;
                                              auVar86._60_4_ = (uint)(bVar39 >> 7) * piVar2[0xf];
                                              auVar85 = vfmadd231ps_avx512f(auVar86,auVar84,auVar85)
                                              ;
                                              puVar3 = (uint *)((long)pvVar1 + uVar64 * 4 + lVar58);
                                              bVar25 = (bool)((byte)(uVar76 >> 1) & 1);
                                              bVar26 = (bool)((byte)(uVar76 >> 2) & 1);
                                              bVar27 = (bool)((byte)(uVar76 >> 3) & 1);
                                              bVar28 = (bool)((byte)(uVar76 >> 4) & 1);
                                              bVar29 = (bool)((byte)(uVar76 >> 5) & 1);
                                              bVar30 = (bool)((byte)(uVar76 >> 6) & 1);
                                              bVar31 = (bool)((byte)(uVar76 >> 7) & 1);
                                              bVar32 = (bool)(bVar39 >> 1 & 1);
                                              bVar33 = (bool)(bVar39 >> 2 & 1);
                                              bVar34 = (bool)(bVar39 >> 3 & 1);
                                              bVar35 = (bool)(bVar39 >> 4 & 1);
                                              bVar36 = (bool)(bVar39 >> 5 & 1);
                                              bVar37 = (bool)(bVar39 >> 6 & 1);
                                              *puVar3 = (uint)(bVar38 & 1) * auVar85._0_4_ |
                                                        (uint)!(bool)(bVar38 & 1) * *puVar3;
                                              puVar3[1] = (uint)bVar25 * auVar85._4_4_ |
                                                          (uint)!bVar25 * puVar3[1];
                                              puVar3[2] = (uint)bVar26 * auVar85._8_4_ |
                                                          (uint)!bVar26 * puVar3[2];
                                              puVar3[3] = (uint)bVar27 * auVar85._12_4_ |
                                                          (uint)!bVar27 * puVar3[3];
                                              puVar3[4] = (uint)bVar28 * auVar85._16_4_ |
                                                          (uint)!bVar28 * puVar3[4];
                                              puVar3[5] = (uint)bVar29 * auVar85._20_4_ |
                                                          (uint)!bVar29 * puVar3[5];
                                              puVar3[6] = (uint)bVar30 * auVar85._24_4_ |
                                                          (uint)!bVar30 * puVar3[6];
                                              puVar3[7] = (uint)bVar31 * auVar85._28_4_ |
                                                          (uint)!bVar31 * puVar3[7];
                                              puVar3[8] = (uint)(bVar39 & 1) * auVar85._32_4_ |
                                                          (uint)!(bool)(bVar39 & 1) * puVar3[8];
                                              puVar3[9] = (uint)bVar32 * auVar85._36_4_ |
                                                          (uint)!bVar32 * puVar3[9];
                                              puVar3[10] = (uint)bVar33 * auVar85._40_4_ |
                                                           (uint)!bVar33 * puVar3[10];
                                              puVar3[0xb] = (uint)bVar34 * auVar85._44_4_ |
                                                            (uint)!bVar34 * puVar3[0xb];
                                              puVar3[0xc] = (uint)bVar35 * auVar85._48_4_ |
                                                            (uint)!bVar35 * puVar3[0xc];
                                              puVar3[0xd] = (uint)bVar36 * auVar85._52_4_ |
                                                            (uint)!bVar36 * puVar3[0xd];
                                              puVar3[0xe] = (uint)bVar37 * auVar85._56_4_ |
                                                            (uint)!bVar37 * puVar3[0xe];
                                              puVar3[0xf] = (uint)(bVar39 >> 7) * auVar85._60_4_ |
                                                            (uint)!(bool)(bVar39 >> 7) * puVar3[0xf]
                                              ;
                                              uVar64 = uVar64 + 0x10;
                                            } while (uVar66 != uVar64);
                                          }
                                          lVar71 = lVar71 + 1;
                                        } while (lVar71 != 0x20);
                                        uVar68 = uVar68 + 0x20;
                                      } while (uVar68 < uVar51);
                                    }
                                    if ((long)uVar51 < (long)uVar50) {
                                      lVar63 = (lVar59 / (lVar9 / lVar48)) * sVar11;
                                      lVar57 = (lVar45 / (lVar65 / lVar61)) * sVar12;
                                      lVar67 = lVar45 * sVar19 + lVar56 * sVar17 + lVar59 * sVar18;
                                      lVar58 = lVar40 + lVar57 + lVar63;
                                      lVar63 = lVar57 + lVar69 + lVar40 + lVar63;
                                      uVar68 = uVar51;
                                      do {
                                        pvVar1 = pgVar7->data;
                                        pvVar23 = dst->data;
                                        auVar84 = vbroadcastss_avx512f
                                                            (ZEXT416(*(uint *)((long)pgVar8->data +
                                                                              lVar45 * sVar16 +
                                                                              lVar59 * sVar15 +
                                                                              uVar68 * sVar14 +
                                                                              lVar56 * sVar13)));
                                        if (0 < (int)uVar53) {
                                          lVar57 = (long)pvVar23 + lVar67;
                                          lVar71 = (long)pvVar1 + lVar58;
                                          uVar64 = 0;
                                          do {
                                            lVar74 = 0;
                                            do {
                                              auVar85 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                             (lVar71 + lVar74),
                                                                            auVar84,*(undefined1
                                                                                      (*) [64])
                                                                                     (lVar57 + 
                                                  lVar74));
                                              *(undefined1 (*) [64])(lVar57 + lVar74) = auVar85;
                                              lVar74 = lVar74 + 0x40;
                                            } while (lVar74 != 0x100);
                                            uVar64 = uVar64 + 0x40;
                                            lVar57 = lVar57 + 0x100;
                                            lVar71 = lVar71 + 0x100;
                                          } while (uVar64 < uVar53);
                                        }
                                        if (uVar53 != uVar75) {
                                          auVar84 = vbroadcastss_avx512f(auVar84._0_16_);
                                          lVar57 = lVar67 + lVar69;
                                          uVar64 = 0;
                                          do {
                                            auVar85 = vpbroadcastq_avx512f();
                                            auVar86 = vporq_avx512f(auVar85,auVar82);
                                            auVar85 = vporq_avx512f(auVar85,auVar83);
                                            uVar60 = vpcmpuq_avx512f(auVar85,auVar79,2);
                                            bVar38 = (byte)uVar60;
                                            uVar60 = vpcmpuq_avx512f(auVar86,auVar79,2);
                                            bVar39 = (byte)uVar60;
                                            uVar76 = CONCAT11(bVar39,bVar38);
                                            piVar2 = (int *)((long)pvVar1 + uVar64 * 4 + lVar63);
                                            auVar87._4_4_ =
                                                 (uint)((byte)(uVar76 >> 1) & 1) * piVar2[1];
                                            auVar87._0_4_ = (uint)(bVar38 & 1) * *piVar2;
                                            auVar87._8_4_ =
                                                 (uint)((byte)(uVar76 >> 2) & 1) * piVar2[2];
                                            auVar87._12_4_ =
                                                 (uint)((byte)(uVar76 >> 3) & 1) * piVar2[3];
                                            auVar87._16_4_ =
                                                 (uint)((byte)(uVar76 >> 4) & 1) * piVar2[4];
                                            auVar87._20_4_ =
                                                 (uint)((byte)(uVar76 >> 5) & 1) * piVar2[5];
                                            auVar87._24_4_ =
                                                 (uint)((byte)(uVar76 >> 6) & 1) * piVar2[6];
                                            auVar87._28_4_ =
                                                 (uint)((byte)(uVar76 >> 7) & 1) * piVar2[7];
                                            auVar87._32_4_ = (uint)(bVar39 & 1) * piVar2[8];
                                            auVar87._36_4_ = (uint)(bVar39 >> 1 & 1) * piVar2[9];
                                            auVar87._40_4_ = (uint)(bVar39 >> 2 & 1) * piVar2[10];
                                            auVar87._44_4_ = (uint)(bVar39 >> 3 & 1) * piVar2[0xb];
                                            auVar87._48_4_ = (uint)(bVar39 >> 4 & 1) * piVar2[0xc];
                                            auVar87._52_4_ = (uint)(bVar39 >> 5 & 1) * piVar2[0xd];
                                            auVar87._56_4_ = (uint)(bVar39 >> 6 & 1) * piVar2[0xe];
                                            auVar87._60_4_ = (uint)(bVar39 >> 7) * piVar2[0xf];
                                            piVar2 = (int *)((long)pvVar23 + uVar64 * 4 + lVar57);
                                            auVar88._4_4_ =
                                                 (uint)((byte)(uVar76 >> 1) & 1) * piVar2[1];
                                            auVar88._0_4_ = (uint)(bVar38 & 1) * *piVar2;
                                            auVar88._8_4_ =
                                                 (uint)((byte)(uVar76 >> 2) & 1) * piVar2[2];
                                            auVar88._12_4_ =
                                                 (uint)((byte)(uVar76 >> 3) & 1) * piVar2[3];
                                            auVar88._16_4_ =
                                                 (uint)((byte)(uVar76 >> 4) & 1) * piVar2[4];
                                            auVar88._20_4_ =
                                                 (uint)((byte)(uVar76 >> 5) & 1) * piVar2[5];
                                            auVar88._24_4_ =
                                                 (uint)((byte)(uVar76 >> 6) & 1) * piVar2[6];
                                            auVar88._28_4_ =
                                                 (uint)((byte)(uVar76 >> 7) & 1) * piVar2[7];
                                            auVar88._32_4_ = (uint)(bVar39 & 1) * piVar2[8];
                                            auVar88._36_4_ = (uint)(bVar39 >> 1 & 1) * piVar2[9];
                                            auVar88._40_4_ = (uint)(bVar39 >> 2 & 1) * piVar2[10];
                                            auVar88._44_4_ = (uint)(bVar39 >> 3 & 1) * piVar2[0xb];
                                            auVar88._48_4_ = (uint)(bVar39 >> 4 & 1) * piVar2[0xc];
                                            auVar88._52_4_ = (uint)(bVar39 >> 5 & 1) * piVar2[0xd];
                                            auVar88._56_4_ = (uint)(bVar39 >> 6 & 1) * piVar2[0xe];
                                            auVar88._60_4_ = (uint)(bVar39 >> 7) * piVar2[0xf];
                                            auVar85 = vfmadd231ps_avx512f(auVar88,auVar84,auVar87);
                                            puVar3 = (uint *)((long)pvVar23 + uVar64 * 4 + lVar57);
                                            bVar25 = (bool)((byte)(uVar76 >> 1) & 1);
                                            bVar26 = (bool)((byte)(uVar76 >> 2) & 1);
                                            bVar27 = (bool)((byte)(uVar76 >> 3) & 1);
                                            bVar28 = (bool)((byte)(uVar76 >> 4) & 1);
                                            bVar29 = (bool)((byte)(uVar76 >> 5) & 1);
                                            bVar30 = (bool)((byte)(uVar76 >> 6) & 1);
                                            bVar31 = (bool)((byte)(uVar76 >> 7) & 1);
                                            bVar32 = (bool)(bVar39 >> 1 & 1);
                                            bVar33 = (bool)(bVar39 >> 2 & 1);
                                            bVar34 = (bool)(bVar39 >> 3 & 1);
                                            bVar35 = (bool)(bVar39 >> 4 & 1);
                                            bVar36 = (bool)(bVar39 >> 5 & 1);
                                            bVar37 = (bool)(bVar39 >> 6 & 1);
                                            *puVar3 = (uint)(bVar38 & 1) * auVar85._0_4_ |
                                                      (uint)!(bool)(bVar38 & 1) * *puVar3;
                                            puVar3[1] = (uint)bVar25 * auVar85._4_4_ |
                                                        (uint)!bVar25 * puVar3[1];
                                            puVar3[2] = (uint)bVar26 * auVar85._8_4_ |
                                                        (uint)!bVar26 * puVar3[2];
                                            puVar3[3] = (uint)bVar27 * auVar85._12_4_ |
                                                        (uint)!bVar27 * puVar3[3];
                                            puVar3[4] = (uint)bVar28 * auVar85._16_4_ |
                                                        (uint)!bVar28 * puVar3[4];
                                            puVar3[5] = (uint)bVar29 * auVar85._20_4_ |
                                                        (uint)!bVar29 * puVar3[5];
                                            puVar3[6] = (uint)bVar30 * auVar85._24_4_ |
                                                        (uint)!bVar30 * puVar3[6];
                                            puVar3[7] = (uint)bVar31 * auVar85._28_4_ |
                                                        (uint)!bVar31 * puVar3[7];
                                            puVar3[8] = (uint)(bVar39 & 1) * auVar85._32_4_ |
                                                        (uint)!(bool)(bVar39 & 1) * puVar3[8];
                                            puVar3[9] = (uint)bVar32 * auVar85._36_4_ |
                                                        (uint)!bVar32 * puVar3[9];
                                            puVar3[10] = (uint)bVar33 * auVar85._40_4_ |
                                                         (uint)!bVar33 * puVar3[10];
                                            puVar3[0xb] = (uint)bVar34 * auVar85._44_4_ |
                                                          (uint)!bVar34 * puVar3[0xb];
                                            puVar3[0xc] = (uint)bVar35 * auVar85._48_4_ |
                                                          (uint)!bVar35 * puVar3[0xc];
                                            puVar3[0xd] = (uint)bVar36 * auVar85._52_4_ |
                                                          (uint)!bVar36 * puVar3[0xd];
                                            puVar3[0xe] = (uint)bVar37 * auVar85._56_4_ |
                                                          (uint)!bVar37 * puVar3[0xe];
                                            puVar3[0xf] = (uint)(bVar39 >> 7) * auVar85._60_4_ |
                                                          (uint)!(bool)(bVar39 >> 7) * puVar3[0xf];
                                            uVar64 = uVar64 + 0x10;
                                          } while (uVar66 != uVar64);
                                        }
                                        uVar68 = uVar68 + 1;
                                        lVar58 = lVar58 + sVar10;
                                        lVar63 = lVar63 + sVar10;
                                      } while ((long)uVar68 < (long)uVar50);
                                    }
                                    lVar62 = lVar62 + 1;
                                  } while (lVar62 < lVar73);
                                  uVar46 = uVar46 + 0x20;
                                  uVar55 = uVar47;
                                } while ((long)uVar47 < (long)uVar54);
                              }
                              lVar44 = lVar72;
                            } while (lVar72 < lVar43);
                            return;
                          }
                          pcVar52 = "nb0 == sizeof(float)";
                          uVar60 = 0xe19;
                        }
                        else {
                          pcVar52 = "nb00 == sizeof(float)";
                          uVar60 = 0xe16;
                        }
                      }
                      else {
                        pcVar52 = "ne3 % ne03 == 0";
                        uVar60 = 0xe13;
                      }
                    }
                    else {
                      pcVar52 = "ne2 % ne02 == 0";
                      uVar60 = 0xe12;
                    }
                  }
                  else {
                    pcVar52 = "ne3 == ne13";
                    uVar60 = 0xe10;
                  }
                }
                else {
                  pcVar52 = "ne2 == ne12";
                  uVar60 = 0xe0f;
                }
              }
              else {
                pcVar52 = "ne1 == ne10";
                uVar60 = 0xe0e;
              }
            }
            else {
              pcVar52 = "ne0 == ne00";
              uVar60 = 0xe0d;
            }
          }
          else {
            pcVar52 = "src1->type == GGML_TYPE_F32";
            uVar60 = 0xe08;
          }
        }
        else {
          pcVar52 = "src0->type == GGML_TYPE_F32";
          uVar60 = 0xe07;
        }
      }
      else {
        pcVar52 = "dst->type == GGML_TYPE_F32";
        uVar60 = 0xe06;
      }
      goto LAB_0013c41c;
    }
    if (uVar54 == 1) {
      uVar60 = 0xef0;
      goto LAB_0013c5a4;
    }
  }
  uVar60 = 0xef9;
LAB_0013c5a4:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar60,"fatal error");
}

Assistant:

void ggml_compute_forward_out_prod(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
            {
                ggml_compute_forward_out_prod_q_f32(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ABORT("fatal error"); // todo
                // ggml_compute_forward_out_prod_f16_f32(params, dst);
            }
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_out_prod_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}